

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall
cmConfigureLog::cmConfigureLog
          (cmConfigureLog *this,string *logDir,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *logVersions)

{
  StreamWriter *pSVar1;
  pointer puVar2;
  bool bVar3;
  StreamWriter *pSVar4;
  StreamWriterBuilder builder;
  StreamWriterBuilder SStack_58;
  
  std::__cxx11::string::string((string *)this,(string *)logDir);
  puVar2 = (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->LogVersions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->LogVersions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  (this->LogVersions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (logVersions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(&this->Stream);
  this->Indent = 0;
  this->Opened = false;
  (this->Encoder)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  bVar3 = ::cm::
          contains<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_0>
                    (&this->LogVersions,&cmConfigureLog::LatestLogVersion);
  if (!bVar3) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->LogVersions,
               &cmConfigureLog::LatestLogVersion);
  }
  Json::StreamWriterBuilder::StreamWriterBuilder(&SStack_58);
  pSVar4 = Json::StreamWriterBuilder::newStreamWriter(&SStack_58);
  pSVar1 = (this->Encoder)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (this->Encoder)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = pSVar4;
  if (pSVar1 != (StreamWriter *)0x0) {
    (*pSVar1->_vptr_StreamWriter[1])();
  }
  Json::StreamWriterBuilder::~StreamWriterBuilder(&SStack_58);
  return;
}

Assistant:

cmConfigureLog::cmConfigureLog(std::string logDir,
                               std::vector<unsigned long> logVersions)
  : LogDir(std::move(logDir))
  , LogVersions(std::move(logVersions))
{
  // Always emit events for the latest log version.
  static const unsigned long LatestLogVersion = 1;
  if (!cm::contains(this->LogVersions, LatestLogVersion)) {
    this->LogVersions.emplace_back(LatestLogVersion);
  }

  Json::StreamWriterBuilder builder;
  this->Encoder.reset(builder.newStreamWriter());
}